

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void ftxui::Render(Screen *screen,Node *node)

{
  ulong in_RAX;
  ulong uVar1;
  long lVar2;
  long lVar3;
  Status status;
  undefined8 local_38;
  
  uVar1 = (ulong)(screen->dimx_ - 1);
  lVar3 = (ulong)(screen->dimy_ - 1) << 0x20;
  local_38 = in_RAX & 0xffffff0000000000;
  (*node->_vptr_Node[5])(node,&local_38);
  if ((local_38._4_1_ == '\x01') && ((int)local_38 < 0x14)) {
    do {
      (*node->_vptr_Node[2])(node);
      (*node->_vptr_Node[3])(node,uVar1 << 0x20,lVar3);
      local_38 = CONCAT44((int)(local_38 >> 0x20),(int)local_38 + 1) & 0xffffff00ffffffff;
      (*node->_vptr_Node[5])(node,&local_38);
      if (local_38._4_1_ != '\x01') break;
    } while ((int)local_38 < 0x14);
  }
  lVar2 = uVar1 << 0x20;
  (screen->stencil).x_min = (int)lVar2;
  (screen->stencil).x_max = (int)((ulong)lVar2 >> 0x20);
  (screen->stencil).y_min = (int)lVar3;
  (screen->stencil).y_max = (int)((ulong)lVar3 >> 0x20);
  (*node->_vptr_Node[4])(node,screen);
  Screen::ApplyShader(screen);
  return;
}

Assistant:

void Render(Screen& screen, Node* node) {
  Box box;
  box.x_min = 0;
  box.y_min = 0;
  box.x_max = screen.dimx() - 1;
  box.y_max = screen.dimy() - 1;

  Node::Status status;
  node->Check(&status);
  const int max_iterations = 20;
  while (status.need_iteration && status.iteration < max_iterations) {
    // Step 1: Find what dimension this elements wants to be.
    node->ComputeRequirement();

    // Step 2: Assign a dimension to the element.
    node->SetBox(box);

    // Check if the element needs another iteration of the layout algorithm.
    status.need_iteration = false;
    status.iteration++;
    node->Check(&status);
  }

  // Step 3: Draw the element.
  screen.stencil = box;
  node->Render(screen);

  // Step 4: Apply shaders
  screen.ApplyShader();
}